

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void purge_logically_deleted_doc_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t metalen;
  void *pvVar3;
  fdb_kvs_handle *in_stack_fffffffffffffac8;
  fdb_file_handle *in_stack_fffffffffffffad0;
  fdb_doc **in_stack_fffffffffffffad8;
  size_t in_stack_fffffffffffffaf0;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  fdb_kvs_handle *in_stack_fffffffffffffb28;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.wal_threshold._4_4_ = 2;
  fconfig.flags._3_1_ = 0;
  fdb_open((fdb_file_handle **)bodybuf._136_8_,(char *)bodybuf._128_8_,(fdb_config *)bodybuf._120_8_
          );
  fdb_kvs_open_default
            (in_stack_fffffffffffffad0,(fdb_kvs_handle **)in_stack_fffffffffffffac8,
             (fdb_kvs_config *)0x116be4);
  pvVar3 = (void *)0x116bfb;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)doc,logCallbackFunc,"purge_logically_deleted_doc_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pvVar3 = (void *)0x116c2e;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xcc8);
    purge_logically_deleted_doc_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xcc8,"void purge_logically_deleted_doc_test()");
    }
  }
  for (n = 0; n < 10; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    in_stack_fffffffffffffb28 = (fdb_kvs_handle *)(&stack0xfffffffffffffac8 + (long)n * 8);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar3 = (void *)0x116d31;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   (size_t)in_stack_fffffffffffffac8,pvVar3,metalen,(void *)0x116d68,
                   in_stack_fffffffffffffaf0);
    pvVar3 = (void *)0x116d81;
    fdb_set((fdb_kvs_handle *)doc,*(fdb_doc **)(&stack0xfffffffffffffac8 + (long)n * 8));
  }
  fdb_doc_create(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 (size_t)in_stack_fffffffffffffac8,pvVar3,0,(void *)0x116dd8,
                 in_stack_fffffffffffffaf0);
  fVar1 = fdb_del(in_stack_fffffffffffffb28,
                  (fdb_doc *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0xcd7);
    purge_logically_deleted_doc_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xcd7,"void purge_logically_deleted_doc_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x116e5b);
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffffac8,'\0');
  pvVar3 = (void *)0x116e7e;
  fdb_compact(in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
  n = 0;
  do {
    if (9 < n) {
      printf("wait for 3 seconds..\n");
      sleep(3);
      pvVar3 = (void *)0x11728d;
      fdb_compact(in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
      n = 0;
      do {
        if (9 < n) {
          fdb_kvs_close(in_stack_fffffffffffffac8);
          fdb_close((fdb_file_handle *)in_stack_fffffffffffffac8);
          for (n = 0; n < 10; n = n + 1) {
            fdb_doc_free((fdb_doc *)0x117672);
          }
          fdb_shutdown();
          memleak_end();
          if (purge_logically_deleted_doc_test::__test_pass == 0) {
            fprintf(_stderr,"%s FAILED\n","purge logically deleted doc test");
          }
          else {
            fprintf(_stderr,"%s PASSED\n","purge logically deleted doc test");
          }
          return;
        }
        fdb_doc_create(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                       (size_t)in_stack_fffffffffffffac8,pvVar3,0,(void *)0x1172df,
                       in_stack_fffffffffffffaf0);
        fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
        if (n == 5) {
          if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd16);
            purge_logically_deleted_doc_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
              __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xd16,"void purge_logically_deleted_doc_test()");
            }
          }
        }
        else {
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd11);
            purge_logically_deleted_doc_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xd11,"void purge_logically_deleted_doc_test()");
            }
          }
          iVar2 = memcmp(pvRam0000000000000038,
                         *(void **)(*(long *)(&stack0xfffffffffffffac8 + (long)n * 8) + 0x38),
                         sRam0000000000000008);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                    *(undefined8 *)(*(long *)(&stack0xfffffffffffffac8 + (long)n * 8) + 0x38),
                    pvRam0000000000000038,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd12);
            purge_logically_deleted_doc_test::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd12,"void purge_logically_deleted_doc_test()");
          }
          iVar2 = memcmp(pvRam0000000000000040,
                         *(void **)(*(long *)(&stack0xfffffffffffffac8 + (long)n * 8) + 0x40),
                         sRam0000000000000010);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                    *(undefined8 *)(*(long *)(&stack0xfffffffffffffac8 + (long)n * 8) + 0x40),
                    pvRam0000000000000040,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd13);
            purge_logically_deleted_doc_test::__test_pass = 0;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd13,"void purge_logically_deleted_doc_test()");
          }
        }
        pvVar3 = (void *)0x1174f3;
        fdb_doc_free((fdb_doc *)0x1174f3);
        fdb_doc_create(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                       (size_t)in_stack_fffffffffffffac8,pvVar3,0,(void *)0x11753a,
                       in_stack_fffffffffffffaf0);
        fVar1 = fdb_get_metaonly((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
        if (n == 5) {
          if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xd23);
            purge_logically_deleted_doc_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
              __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xd23,"void purge_logically_deleted_doc_test()");
            }
          }
        }
        else if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0xd20);
          purge_logically_deleted_doc_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0xd20,"void purge_logically_deleted_doc_test()");
          }
        }
        pvVar3 = (void *)0x11762a;
        fdb_doc_free((fdb_doc *)0x11762a);
        n = n + 1;
      } while( true );
    }
    fdb_doc_create(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   (size_t)in_stack_fffffffffffffac8,pvVar3,0,(void *)0x116ed0,
                   in_stack_fffffffffffffaf0);
    fVar1 = fdb_get((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
    if (n == 5) {
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xcee);
        purge_logically_deleted_doc_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xcee,"void purge_logically_deleted_doc_test()");
        }
      }
    }
    else {
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xce9);
        purge_logically_deleted_doc_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xce9,"void purge_logically_deleted_doc_test()");
        }
      }
      iVar2 = memcmp(pvRam0000000000000038,
                     *(void **)(*(long *)(&stack0xfffffffffffffac8 + (long)n * 8) + 0x38),
                     sRam0000000000000008);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffffac8 + (long)n * 8) + 0x38),
                pvRam0000000000000038,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xcea);
        purge_logically_deleted_doc_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xcea,"void purge_logically_deleted_doc_test()");
      }
      iVar2 = memcmp(pvRam0000000000000040,
                     *(void **)(*(long *)(&stack0xfffffffffffffac8 + (long)n * 8) + 0x40),
                     sRam0000000000000010);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)(*(long *)(&stack0xfffffffffffffac8 + (long)n * 8) + 0x40),
                pvRam0000000000000040,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xceb);
        purge_logically_deleted_doc_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xceb,"void purge_logically_deleted_doc_test()");
      }
    }
    pvVar3 = (void *)0x1170e4;
    fdb_doc_free((fdb_doc *)0x1170e4);
    fdb_doc_create(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   (size_t)in_stack_fffffffffffffac8,pvVar3,0,(void *)0x11712b,
                   in_stack_fffffffffffffaf0);
    fVar1 = fdb_get_metaonly((fdb_kvs_handle *)doc,(fdb_doc *)0x0);
    if (n == 5) {
      if ((fVar1 != FDB_RESULT_SUCCESS) && (fVar1 != FDB_RESULT_KEY_NOT_FOUND)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xcfd);
        purge_logically_deleted_doc_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS && fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_KEY_NOT_FOUND",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xcfd,"void purge_logically_deleted_doc_test()");
        }
      }
    }
    else if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xcf8);
      purge_logically_deleted_doc_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xcf8,"void purge_logically_deleted_doc_test()");
      }
    }
    pvVar3 = (void *)0x11724f;
    fdb_doc_free((fdb_doc *)0x11724f);
    n = n + 1;
  } while( true );
}

Assistant:

void purge_logically_deleted_doc_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* fdb_test_config.json > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 2;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "purge_logically_deleted_doc_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta, doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve metadata
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get_metaonly(db, rdoc);
        if (i != 5) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // If the above compaction takes longer than two secs (e.g., slow disk),
            // then, fdb_get_metaonly will return KEY_NOT_FOUND error.
            TEST_CHK(status == FDB_RESULT_SUCCESS ||
                     status == FDB_RESULT_KEY_NOT_FOUND);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    printf("wait for 3 seconds..\n");
    sleep(3);

    // do one more compaction
    fdb_compact(dbfile, (char *) "./dummy3");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;

        // retrieve metadata
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get_metaonly(db, rdoc);
        if (i != 5) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // logically deletec document must be purged during the compaction
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("purge logically deleted doc test");
}